

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpTest_Disassemble_Test::InterpTest_Disassemble_Test(InterpTest_Disassemble_Test *this)

{
  InterpTest_Disassemble_Test *this_local;
  
  InterpTest::InterpTest(&this->super_InterpTest);
  (this->super_InterpTest).super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_Disassemble_Test_005c2800;
  return;
}

Assistant:

TEST_F(InterpTest, Disassemble) {
  ReadModule(s_fac_module);

  MemoryStream stream;
  module_desc_.istream.Disassemble(&stream);
  auto buf = stream.ReleaseOutputBuffer();

  ExpectBufferStrEq(*buf,
R"(   0| alloca 1
   8| i32.const 1
  16| local.set $2, %[-1]
  24| local.get $1
  32| local.get $3
  40| i32.eqz %[-1]
  44| br_unless @60, %[-1]
  52| br @116
  60| local.get $3
  68| i32.mul %[-2], %[-1]
  72| local.set $2, %[-1]
  80| local.get $2
  88| i32.const 1
  96| i32.sub %[-2], %[-1]
 100| local.set $3, %[-1]
 108| br @24
 116| drop_keep $2 $1
 128| return
)");
}